

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_image::set_block_pixels
          (dxt_image *this,uint block_x,uint block_y,color_quad_u8 *pPixels,pack_params *p,
          set_block_pixels_context *context)

{
  char cVar1;
  dxt_format dVar2;
  element_type eVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined8 uVar8;
  color_quad_u8 *pcVar9;
  bool bVar10;
  uint uVar11;
  byte bVar12;
  long lVar13;
  uchar uVar14;
  ulong uVar15;
  etc1_block *dst_block;
  etc1_block *dst_block_00;
  dxt1_block *pDXT1_block;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  dxt5_block *pDXT5_block;
  etc1_pack_params pack_params;
  dxt1_endpoint_optimizer *dxt1_optimizer;
  results results;
  uint8 selectors [16];
  params local_c8;
  uint local_80;
  uint local_7c;
  color_quad_u8 *local_78;
  set_block_pixels_context *local_70;
  results local_68;
  byte local_48 [16];
  dxt5_endpoint_optimizer *local_38;
  
  uVar8 = local_c8._0_8_;
  dst_block_00 = (etc1_block *)
                 (this->m_pElements +
                 (this->m_blocks_x * block_y + block_x) * this->m_num_elements_per_block);
  dVar2 = this->m_format;
  switch(dVar2) {
  case cETC1:
    uVar17 = 0;
    if (cCRNDXTQualityFast < p->m_quality) {
      uVar17 = (p->m_quality != cCRNDXTQualityNormal) + 1;
    }
    local_c8._5_3_ = local_c8._5_3_;
    local_c8._4_1_ = p->m_dithering;
    goto LAB_001885d7;
  case cETC2:
    local_c8._5_3_ = local_c8._5_3_;
    local_c8._4_1_ = p->m_dithering;
    uVar17 = 0;
    if (cCRNDXTQualityFast < p->m_quality) {
      uVar17 = (p->m_quality != cCRNDXTQualityNormal) + 1;
    }
LAB_001885d7:
    local_c8.m_block_index = uVar17;
    rg_etc1::pack_etc1_block(dst_block_00,(uint *)pPixels,(etc1_pack_params *)&local_c8);
    break;
  case cETC2A:
    uVar17 = 0;
    if (cCRNDXTQualityFast < p->m_quality) {
      uVar17 = (p->m_quality != cCRNDXTQualityNormal) + 1;
    }
    if (this->m_num_elements_per_block != 0) {
      uVar16 = 0;
      do {
        if (this->m_element_type[uVar16] == cAlphaETC2) {
          local_c8._4_4_ = (int)this->m_element_component_index[uVar16];
          local_c8.m_block_index = uVar17;
          rg_etc1::pack_etc2_alpha(dst_block_00,(uint *)pPixels,(etc2a_pack_params *)&local_c8);
        }
        else {
          local_c8._5_3_ = local_c8._5_3_;
          local_c8._4_1_ = p->m_dithering;
          local_c8.m_block_index = uVar17;
          rg_etc1::pack_etc1_block(dst_block_00,(uint *)pPixels,(etc1_pack_params *)&local_c8);
        }
        uVar16 = uVar16 + 1;
        dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
    break;
  case cETC1S:
    uVar6 = p->m_perceptual;
    uVar7 = p->m_dithering;
    local_c8._5_1_ = uVar7;
    local_c8._4_1_ = uVar6;
    local_c8._6_2_ = SUB82(uVar8,6);
    local_c8.m_block_index = 0;
    if (cCRNDXTQualityFast < p->m_quality) {
      local_c8.m_block_index = (p->m_quality != cCRNDXTQualityNormal) + 1;
    }
    pack_etc1s_block(dst_block_00,pPixels,(crn_etc1_pack_params *)&local_c8);
    break;
  case cETC2AS:
    if (this->m_num_elements_per_block != 0) {
      uVar16 = 0;
      do {
        uVar8 = local_c8._0_8_;
        if (this->m_element_type[uVar16] == cAlphaETC2) {
          local_c8.m_block_index = (p->m_quality != cCRNDXTQualityNormal) + 1;
          if (p->m_quality < cCRNDXTQualityNormal) {
            local_c8.m_block_index = 0;
          }
          local_c8._4_4_ = (int)this->m_element_component_index[uVar16];
          rg_etc1::pack_etc2_alpha(dst_block_00,(uint *)pPixels,(etc2a_pack_params *)&local_c8);
        }
        else {
          uVar4 = p->m_perceptual;
          uVar5 = p->m_dithering;
          local_c8._5_1_ = uVar5;
          local_c8._4_1_ = uVar4;
          local_c8._6_2_ = SUB82(uVar8,6);
          local_c8.m_block_index = (p->m_quality != cCRNDXTQualityNormal) + 1;
          if (p->m_quality < cCRNDXTQualityNormal) {
            local_c8.m_block_index = 0;
          }
          pack_etc1s_block(dst_block_00,pPixels,(crn_etc1_pack_params *)&local_c8);
        }
        uVar16 = uVar16 + 1;
        dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
    break;
  default:
    if (((p->m_compressor == cCRNDXTCompressorRYG) && ((uint)dVar2 < 5)) &&
       ((0x19U >> (dVar2 & 0x1f) & 1) != 0)) {
      lVar13 = 0;
      do {
        *(uchar *)(&local_c8.m_block_index + lVar13) = pPixels[lVar13].field_0.field_0.b;
        *(uchar *)((long)&local_c8.m_block_index + lVar13 * 4 + 1) =
             pPixels[lVar13].field_0.field_0.g;
        *(uchar *)((long)&local_c8.m_block_index + lVar13 * 4 + 2) =
             pPixels[lVar13].field_0.field_0.r;
        if (dVar2 == cDXT1) {
          uVar14 = 0xff;
        }
        else {
          uVar14 = pPixels[lVar13].field_0.field_0.a;
        }
        *(uchar *)((long)&local_c8.m_block_index + lVar13 * 4 + 3) = uVar14;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      if (dVar2 == cDXT5A) {
        ryg_dxt::sCompressDXT5ABlock((sU8 *)dst_block_00,&local_c8.m_block_index);
      }
      else {
        ryg_dxt::sCompressDXTBlock((sU8 *)dst_block_00,&local_c8.m_block_index,dVar2 == cDXT5,0);
      }
    }
    else if (dVar2 == cDXT1A || p->m_compressor != cCRNDXTCompressorCRNF) {
      if (this->m_num_elements_per_block != 0) {
        local_38 = &context->m_dxt5_optimizer;
        uVar16 = 0;
        local_80 = block_x;
        local_7c = block_y;
        local_78 = pPixels;
        local_70 = context;
        do {
          pcVar9 = local_78;
          eVar3 = this->m_element_type[uVar16];
          if (eVar3 == cAlphaDXT5) {
            local_68.m_error = (uint64)local_48;
            local_c8.m_block_index = this->m_blocks_x * local_7c + local_80;
            local_c8.m_dxt1a_alpha_threshold = (int)this->m_element_component_index[uVar16];
            local_c8.m_num_pixels = 0x10;
            local_c8._29_3_ = local_c8._29_3_;
            local_c8.m_quality = p->m_quality;
            local_c8.m_pixels_have_alpha = p->m_use_both_block_types;
            local_c8.m_pPixels = local_78;
            bVar10 = dxt5_endpoint_optimizer::compute
                               (local_38,(params *)&local_c8,(results *)&local_68);
            if (bVar10) {
              (dst_block_00->field_0).m_bytes[0] = (uint8)local_68.m_pSelectors;
              (dst_block_00->field_0).m_bytes[1] = local_68.m_pSelectors._1_1_;
              uVar11 = 0;
              uVar15 = 0;
              do {
                uVar18 = (ulong)(uVar11 >> 3);
                uVar19 = (uint)dst_block_00->m_low_color[uVar18 - 6];
                if (uVar15 < 0xe) {
                  uVar19 = (uint)CONCAT11(dst_block_00->m_low_color[uVar18 - 5],
                                          dst_block_00->m_low_color[uVar18 - 6]);
                }
                bVar12 = (byte)uVar11 & 7;
                uVar19 = (uint)local_48[uVar15] << bVar12 | ~(7 << bVar12) & uVar19;
                dst_block_00->m_low_color[uVar18 - 6] = (uint8)uVar19;
                if (uVar15 < 0xe) {
                  dst_block_00->m_low_color[uVar18 - 5] = (uint8)(uVar19 >> 8);
                }
                uVar15 = uVar15 + 1;
                uVar11 = uVar11 + 3;
              } while (uVar15 != 0x10);
            }
          }
          else if (eVar3 == cAlphaDXT3) {
            cVar1 = this->m_element_component_index[uVar16];
            uVar15 = 0;
            do {
              dxt3_block::set_alpha
                        ((dxt3_block *)dst_block_00,(uint)uVar15 & 3,
                         (uint)(uVar15 >> 2) & 0x3fffffff,
                         (uint)pcVar9[uVar15].field_0.c[(uint)(int)cVar1],true);
              uVar15 = uVar15 + 1;
            } while (uVar15 != 0x10);
          }
          else if (eVar3 == cColorDXT1) {
            if (this->m_format == cDXT1A) {
              local_c8.m_pixels_have_alpha = true;
              if (p->m_dxt1a_alpha_threshold <= (uint)(local_78->field_0).field_0.a) {
                uVar15 = 0;
                do {
                  uVar18 = uVar15;
                  if (uVar18 == 0xf) break;
                  uVar15 = uVar18 + 1;
                } while (p->m_dxt1a_alpha_threshold <= (uint)local_78[uVar18 + 1].field_0.field_0.a)
                ;
                local_c8.m_pixels_have_alpha = uVar18 < 0xf;
              }
            }
            else {
              local_c8.m_pixels_have_alpha = false;
            }
            local_68.m_pSelectors = local_48;
            local_c8.m_force_alpha_blocks = false;
            local_c8.m_block_index = this->m_blocks_x * local_7c + local_80;
            local_c8.m_grayscale_sampling = p->m_grayscale_sampling;
            local_c8.m_perceptual = p->m_perceptual;
            local_c8.m_quality = p->m_quality;
            local_c8.m_use_alpha_blocks = p->m_use_both_block_types;
            local_c8.m_pPixels = local_78;
            local_c8.m_dxt1a_alpha_threshold = p->m_dxt1a_alpha_threshold;
            local_c8.m_num_pixels = 0x10;
            local_c8.m_endpoint_caching = p->m_endpoint_caching;
            local_c8.m_use_transparent_indices_for_black = p->m_use_transparent_indices_for_black;
            if (1 < (uint)this->m_format) {
              local_c8._24_6_ = ZEXT56((uint5)local_c8._24_5_);
            }
            bVar10 = dxt1_endpoint_optimizer::compute
                               (&local_70->m_dxt1_optimizer,&local_c8,&local_68);
            if (bVar10) {
              *(uint16 *)&dst_block_00->field_0 = local_68.m_low_color;
              *(uint16 *)((long)&dst_block_00->field_0 + 2) = local_68.m_high_color;
              bVar12 = 0;
              uVar15 = 0;
              do {
                uVar18 = uVar15 >> 2 & 0x3fffffff;
                dst_block_00->m_low_color[uVar18 - 4] =
                     local_48[uVar15] << (bVar12 & 6) |
                     ~(byte)(3 << (bVar12 & 6)) & dst_block_00->m_low_color[uVar18 - 4];
                uVar15 = uVar15 + 1;
                bVar12 = bVar12 + 2;
              } while (uVar15 != 0x10);
            }
          }
          uVar16 = uVar16 + 1;
          dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
        } while (uVar16 < this->m_num_elements_per_block);
      }
    }
    else if (this->m_num_elements_per_block != 0) {
      uVar16 = 0;
      do {
        eVar3 = this->m_element_type[uVar16];
        if (eVar3 == cAlphaDXT5) {
          dxt_fast::compress_alpha_block
                    ((dxt5_block *)dst_block_00,pPixels,(int)this->m_element_component_index[uVar16]
                    );
        }
        else if (eVar3 == cAlphaDXT3) {
          cVar1 = this->m_element_component_index[uVar16];
          uVar15 = 0;
          do {
            dxt3_block::set_alpha
                      ((dxt3_block *)dst_block_00,(uint)uVar15 & 3,(uint)(uVar15 >> 2) & 0x3fffffff,
                       (uint)pPixels[uVar15].field_0.c[(uint)(int)cVar1],true);
            uVar15 = uVar15 + 1;
          } while (uVar15 != 0x10);
        }
        else if (eVar3 == cColorDXT1) {
          dxt_fast::compress_color_block
                    ((dxt1_block *)dst_block_00,pPixels,cCRNDXTQualityFast < p->m_quality);
        }
        uVar16 = uVar16 + 1;
        dst_block_00 = (etc1_block *)dst_block_00->m_low_color;
      } while (uVar16 < this->m_num_elements_per_block);
    }
  }
  return;
}

Assistant:

void dxt_image::set_block_pixels(
        uint block_x, uint block_y, const color_quad_u8* pPixels, const pack_params& p,
        set_block_pixels_context& context)
    {
        element* pElement = &get_element(block_x, block_y, 0);

        if (m_format == cETC1)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);

#if CRNLIB_USE_RG_ETC1
            rg_etc1::etc1_quality etc_quality = rg_etc1::cHighQuality;
            if (p.m_quality <= cCRNDXTQualityFast)
            {
                etc_quality = rg_etc1::cLowQuality;
            }
            else if (p.m_quality <= cCRNDXTQualityNormal)
            {
                etc_quality = rg_etc1::cMediumQuality;
            }

            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            //pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
#else
            crn_etc_quality etc_quality = cCRNETCQualitySlow;
            if (p.m_quality <= cCRNDXTQualityFast)
                etc_quality = cCRNETCQualityFast;
            else if (p.m_quality <= cCRNDXTQualityNormal)
                etc_quality = cCRNETCQualityMedium;

            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_quality = etc_quality;
            pack_params.m_dithering = p.m_dithering;

            pack_etc1_block(dst_block, pPixels, pack_params, context.m_etc1_optimizer);
#endif
        }
        else if (m_format == cETC2)
        {
            etc1_block& dst_block = *reinterpret_cast<etc1_block*>(pElement);
            rg_etc1::etc1_pack_params pack_params;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                   : rg_etc1::cHighQuality;
            rg_etc1::pack_etc1_block(&dst_block, (uint32*)pPixels, pack_params);
        }
        else if (m_format == cETC2A)
        {
            rg_etc1::etc1_quality etc_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                               : rg_etc1::cHighQuality;
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = etc_quality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    rg_etc1::etc1_pack_params pack_params;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = etc_quality;
                    rg_etc1::pack_etc1_block(pElement, (uint32*)pPixels, pack_params);
                }
            }
        }
        else if (m_format == cETC1S)
        {
            crn_etc1_pack_params pack_params;
            pack_params.m_perceptual = p.m_perceptual;
            pack_params.m_dithering = p.m_dithering;
            pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                 : cCRNETCQualitySlow;
            pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
        }
        else if (m_format == cETC2AS)
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                if (m_element_type[element_index] == cAlphaETC2)
                {
                    rg_etc1::etc2a_pack_params pack_params;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? rg_etc1::cLowQuality : p.m_quality <= cCRNDXTQualityNormal ? rg_etc1::cMediumQuality
                                                                                                                                           : rg_etc1::cHighQuality;
                    pack_params.comp_index = m_element_component_index[element_index];
                    rg_etc1::pack_etc2_alpha(pElement, (uint32*)pPixels, pack_params);
                }
                else
                {
                    crn_etc1_pack_params pack_params;
                    pack_params.m_perceptual = p.m_perceptual;
                    pack_params.m_dithering = p.m_dithering;
                    pack_params.m_quality = p.m_quality <= cCRNDXTQualityFast ? cCRNETCQualityFast : p.m_quality <= cCRNDXTQualityNormal ? cCRNETCQualityMedium
                                                                                                                                         : cCRNETCQualitySlow;
                    pack_etc1s_block(*(etc1_block*)pElement, pPixels, pack_params);
                }
            }
        }
        else
#if CRNLIB_SUPPORT_SQUISH
            if ((p.m_compressor == cCRNDXTCompressorSquish) && ((m_format == cDXT1) || (m_format == cDXT1A) || (m_format == cDXT3) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            uint squish_flags = 0;
            if ((m_format == cDXT1) || (m_format == cDXT1A))
                squish_flags = squish::kDxt1;
            else if (m_format == cDXT3)
                squish_flags = squish::kDxt3;
            else if (m_format == cDXT5A)
                squish_flags = squish::kDxt5A;
            else
                squish_flags = squish::kDxt5;

            if (p.m_perceptual)
                squish_flags |= squish::kColourMetricPerceptual;
            else
                squish_flags |= squish::kColourMetricUniform;

            if (p.m_quality >= cCRNDXTQualityBetter)
                squish_flags |= squish::kColourIterativeClusterFit;
            else if (p.m_quality == cCRNDXTQualitySuperFast)
                squish_flags |= squish::kColourRangeFit;

            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            memcpy(pixels, pPixels, sizeof(color_quad_u8) * cDXTBlockSize * cDXTBlockSize);

            if (m_format == cDXT1)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    pixels[i].a = 255;
            }
            else if (m_format == cDXT1A)
            {
                for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    if (pixels[i].a < p.m_dxt1a_alpha_threshold)
                        pixels[i].a = 0;
                    else
                        pixels[i].a = 255;
            }

            squish::Compress(reinterpret_cast<const squish::u8*>(pixels), pElement, squish_flags);
        }

        else
#endif // CRNLIB_SUPPORT_SQUISH \
    // RYG doesn't support DXT1A
            if ((p.m_compressor == cCRNDXTCompressorRYG) && ((m_format == cDXT1) || (m_format == cDXT5) || (m_format == cDXT5A)))
        {
            color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

            for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
            {
                pixels[i].r = pPixels[i].b;
                pixels[i].g = pPixels[i].g;
                pixels[i].b = pPixels[i].r;

                if (m_format != cDXT1)
                {
                    pixels[i].a = pPixels[i].a;
                }
                else
                {
                    pixels[i].a = 255;
                }
            }

            if (m_format == cDXT5A)
            {
                ryg_dxt::sCompressDXT5ABlock((sU8*)pElement, (const sU32*)pixels);
            }
            else
            {
                ryg_dxt::sCompressDXTBlock((sU8*)pElement, (const sU32*)pixels, m_format == cDXT5, 0);
            }
        }
        else if ((p.m_compressor == cCRNDXTCompressorCRNF) && (m_format != cDXT1A))
        {
            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);
                    dxt_fast::compress_color_block(pDXT1_block, pPixels, p.m_quality >= cCRNDXTQualityNormal);

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);
                    dxt_fast::compress_alpha_block(pDXT5_block, pPixels, m_element_component_index[element_index]);

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
        else
        {
            dxt1_endpoint_optimizer& dxt1_optimizer = context.m_dxt1_optimizer;
            dxt5_endpoint_optimizer& dxt5_optimizer = context.m_dxt5_optimizer;

            for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
            {
                switch (m_element_type[element_index])
                {
                case cColorDXT1:
                {
                    dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                    bool pixels_have_alpha = false;
                    if (m_format == cDXT1A)
                    {
                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            if (pPixels[i].a < p.m_dxt1a_alpha_threshold)
                            {
                                pixels_have_alpha = true;
                                break;
                            }
                        }
                    }

                    dxt1_endpoint_optimizer::results results;
                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt1_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_quality = p.m_quality;
                    params.m_perceptual = p.m_perceptual;
                    params.m_grayscale_sampling = p.m_grayscale_sampling;
                    params.m_pixels_have_alpha = pixels_have_alpha;
                    params.m_use_alpha_blocks = p.m_use_both_block_types;
                    params.m_use_transparent_indices_for_black = p.m_use_transparent_indices_for_black;
                    params.m_dxt1a_alpha_threshold = p.m_dxt1a_alpha_threshold;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_endpoint_caching = p.m_endpoint_caching;

                    if ((m_format != cDXT1) && (m_format != cDXT1A))
                    {
                        params.m_use_alpha_blocks = false;
                    }

                    if (!dxt1_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT1_block->set_low_color(results.m_low_color);
                    pDXT1_block->set_high_color(results.m_high_color);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT1_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT5:
                {
                    dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                    dxt5_endpoint_optimizer::results results;

                    uint8 selectors[cDXTBlockSize * cDXTBlockSize];
                    results.m_pSelectors = selectors;

                    dxt5_endpoint_optimizer::params params;
                    params.m_block_index = block_x + block_y * m_blocks_x;
                    params.m_pPixels = pPixels;
                    params.m_num_pixels = cDXTBlockSize * cDXTBlockSize;
                    params.m_comp_index = m_element_component_index[element_index];
                    params.m_quality = p.m_quality;
                    params.m_use_both_block_types = p.m_use_both_block_types;

                    if (!dxt5_optimizer.compute(params, results))
                    {
                        CRNLIB_ASSERT(0);
                        break;
                    }

                    pDXT5_block->set_low_alpha(results.m_first_endpoint);
                    pDXT5_block->set_high_alpha(results.m_second_endpoint);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT5_block->set_selector(i & 3, i >> 2, selectors[i]);
                    }

                    break;
                }
                case cAlphaDXT3:
                {
                    const int comp_index = m_element_component_index[element_index];

                    dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        pDXT3_block->set_alpha(i & 3, i >> 2, pPixels[i][comp_index], true);
                    }

                    break;
                }
                default:
                    break;
                }
            }
        }
    }